

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O0

char __thiscall TextProviderString::peek_next(TextProviderString *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  difference_type dVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  int local_70;
  int peeked_at_index;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  TextProviderString *local_18;
  TextProviderString *this_local;
  
  local_18 = this;
  bVar1 = std::
          optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value(&this->m_iterator);
  if (bVar1) {
    __lhs = std::
            optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::value(&this->m_iterator);
    local_78._M_current = (char *)std::__cxx11::string::begin();
    dVar4 = __gnu_cxx::operator-(__lhs,&local_78);
    local_70 = (int)dVar4 + 2;
    uVar2 = (*(this->super_TextProvider)._vptr_TextProvider[2])();
    if (((uVar2 & 1) == 0) ||
       (uVar5 = (ulong)local_70, uVar6 = std::__cxx11::string::size(), uVar6 <= uVar5)) {
      this_local._7_1_ = '\0';
    }
    else {
      pcVar7 = (char *)std::__cxx11::string::at((ulong)&this->m_text);
      this_local._7_1_ = *pcVar7;
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_TextProvider).m_logger);
    std::__cxx11::string::string
              (local_38,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,
               "Cannot yet use peek before a first advance with the textProviderString, sorry :/",
               &local_59);
    (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::~string(local_38);
    (this->super_TextProvider).m_has_error = true;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

char TextProviderString::peek_next()
{
	if( !m_iterator.has_value())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"Cannot yet use peek before a first advance with the textProviderString, sorry :/");
		m_has_error = true;
		return '\0';
	}

	int peeked_at_index = (int)(m_iterator.value() - m_text.begin()) + 2;

	if(is_valid() && peeked_at_index < m_text.size())
	{
		return m_text.at(peeked_at_index);
	}
	else
	{
		return '\0';
	}
}